

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O3

monst * beam_hit(int ddx,int ddy,int range,int weapon,_func_int_monst_ptr_obj_ptr *fhitm,
                _func_int_obj_ptr_obj_ptr *fhito,obj *obj,boolean *obj_destroyed)

{
  ushort uVar1;
  xchar x;
  xchar y;
  boolean bVar2;
  int iVar3;
  monst *worm;
  char *pcVar4;
  undefined8 extraout_RAX;
  obj *poVar5;
  trap *ptVar6;
  char *pcVar7;
  uint uVar8;
  char cVar9;
  undefined4 uVar10;
  int iVar11;
  undefined4 in_register_00000034;
  long lVar12;
  byte bVar13;
  int iVar14;
  undefined4 in_register_0000003c;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  bool bVar18;
  int local_7c;
  int local_78;
  byte local_71;
  undefined4 local_70;
  uint local_6c;
  undefined8 local_68;
  undefined8 local_60;
  uint local_54;
  ulong local_50;
  uint local_44;
  _func_int_monst_ptr_obj_ptr *local_40;
  _func_int_obj_ptr_obj_ptr *local_38;
  
  poVar5 = obj;
  local_68 = CONCAT44(in_register_0000003c,ddx);
  local_60 = CONCAT44(in_register_00000034,ddy);
  uVar16 = (ulong)(uint)weapon;
  if (obj_destroyed != (boolean *)0x0) {
    *obj_destroyed = '\0';
  }
  local_38 = fhito;
  if (weapon == 2) {
    local_68._0_1_ = (char)ddx;
    bhitpos.x = u.ux + (char)local_68;
    local_60._0_1_ = (char)ddy;
    bhitpos.y = u.uy + (char)local_60;
    range = range + -1;
LAB_00295ab2:
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
      iVar11 = (int)poVar5->otyp;
    }
    else {
      iVar11 = display_rng(0x219);
      iVar11 = iVar11 + 1;
    }
    iVar11 = iVar11 + 1;
    iVar14 = -4;
  }
  else {
    bhitpos.x = u.ux;
    bhitpos.y = u.uy;
    if (weapon != 3) {
      if ((weapon & 0xfffffffbU) == 0) goto LAB_00295b0b;
      goto LAB_00295ab2;
    }
    iVar14 = -1;
    iVar11 = 0x40002;
  }
  tmp_at(iVar14,iVar11);
LAB_00295b0b:
  if (range < 1) {
    uVar17 = weapon & 0xfffffffb;
    uVar10 = 0;
  }
  else {
    local_44 = weapon - 1;
    uVar17 = weapon & 0xfffffffb;
    bVar18 = false;
    local_70 = 0;
    local_6c = uVar17;
    local_50 = uVar16;
    local_40 = fhitm;
    while( true ) {
      iVar11 = (int)uVar16;
      cVar9 = (char)local_68 + bhitpos.x;
      bVar13 = bhitpos.y + (char)local_60;
      local_78 = (int)cVar9;
      local_7c = (int)(char)bVar13;
      uVar10 = local_70;
      if ((0x4e < (byte)(cVar9 - 1U)) || (0x14 < bVar13)) goto LAB_002965ec;
      bhitpos.x = cVar9;
      bhitpos.y = bVar13;
      if (((byte)(obj->oclass | 4U) == 6) &&
         ((objects[obj->otyp].oc_subtyp == '\x04' &&
          (cVar9 = inside_shop(level,cVar9,bVar13), cVar9 != '\0')))) {
        worm = shkcatch(obj,(xchar)local_78,(xchar)local_7c);
        if (worm != (monst *)0x0) goto LAB_00296631;
      }
      iVar3 = local_78;
      iVar14 = local_7c;
      local_71 = level->locations[bhitpos.x][bhitpos.y].typ;
      local_54 = (uint)local_71;
      if ((local_44 < 2) && (local_71 == 0x16)) break;
      if (iVar11 == 0) {
        bVar2 = find_drawbridge(&local_78,&local_7c);
        bVar18 = true;
        if (bVar2 != '\0') {
          uVar1 = obj->otyp;
          if (uVar1 < 0x1c4) {
            if (uVar1 == 0x186) {
LAB_002961f3:
              bVar2 = is_db_wall((int)bhitpos.x,(int)bhitpos.y);
              if (bVar2 != '\0') {
                if (((viz_array[local_7c][local_78] & 2U) != 0) ||
                   ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0)) {
                  discover_object((int)obj->otyp,'\x01','\x01');
                }
                open_drawbridge(local_78,local_7c);
              }
LAB_002962e9:
              bVar18 = true;
            }
            else {
              if (uVar1 == 0x187) goto LAB_002962b6;
              if (uVar1 == 0x18c) goto LAB_002962f1;
            }
          }
          else if (uVar1 == 0x1c4) {
LAB_002962b6:
            if (local_54 == 0xc) {
              destroy_drawbridge(local_78,local_7c);
              discover_object((int)obj->otyp,'\x01','\x01');
              goto LAB_002962e9;
            }
          }
          else if (uVar1 == 0x1cd) {
LAB_002962f1:
            if ((((viz_array[local_7c][local_78] & 2U) != 0) ||
                ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0)) &&
               (level->locations[local_78][local_7c].typ == '$')) {
              discover_object((uint)uVar1,'\x01','\x01');
            }
            bVar2 = close_drawbridge(local_78,local_7c);
            bVar18 = true;
            if (bVar2 == '\0') {
              return (monst *)0x0;
            }
          }
          else if (uVar1 == 0x1cc) goto LAB_002961f3;
        }
      }
      else {
        bVar18 = false;
      }
LAB_00295c96:
      iVar14 = range + -1;
      lVar15 = (long)bhitpos.x;
      lVar12 = (long)bhitpos.y;
      worm = level->monsters[lVar15][lVar12];
      if ((worm == (monst *)0x0) || ((*(uint *)&worm->field_0x60 >> 9 & 1) != 0)) {
        range = iVar14;
        if ((bVar18) &&
           ((obj->otyp == 0x1ce && ((level->locations[lVar15][lVar12].field_0x6 & 8) != 0)))) {
          unmap_object((int)bhitpos.x,(int)bhitpos.y);
          newsym(local_78,local_7c);
        }
      }
      else {
        notonhead = true;
        if (bhitpos.x == worm->mx) {
          notonhead = bhitpos.y != worm->my;
        }
        if (iVar11 == 0) {
          (*local_40)(worm,obj);
          range = range + -4;
        }
        else if (iVar11 == 3) {
          if ((*(uint *)&worm->field_0x60 & 2) == 0) goto LAB_00296631;
          obj->ox = u.ux;
          obj->oy = u.uy;
          flash_hits_mon(worm,obj);
          range = iVar14;
        }
        else {
          if (iVar11 != 4) {
            tmp_at(-6,0);
            lVar12 = (long)bhitpos.y;
            lVar15 = (long)bhitpos.x;
          }
          if ((viz_array[lVar12][lVar15] & 2U) == 0) {
            return worm;
          }
          if (worm->wormno == '\0') {
            if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_002963c3;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002962a7;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0029629e;
            }
            else {
LAB_0029629e:
              if (ublindf == (obj *)0x0) goto LAB_00296411;
LAB_002962a7:
              if (ublindf->oartifact != '\x1d') goto LAB_00296411;
            }
            if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                 (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                ((viz_array[worm->my][worm->mx] & 1U) != 0)) && ((worm->data->mflags3 & 0x200) != 0)
               ) goto LAB_002963c3;
          }
          else {
            bVar2 = worm_known(level,worm);
            if (bVar2 != '\0') {
LAB_002963c3:
              uVar17 = *(uint *)&worm->field_0x60;
              if ((((uVar17 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar17 & 0x280) == 0) goto LAB_00296404;
              }
              else if (((uVar17 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00296404:
                if ((u._1052_1_ & 0x20) == 0) {
                  return worm;
                }
              }
            }
          }
LAB_00296411:
          if (((worm->data->mflags1 & 0x10000) == 0) &&
             ((poVar5 = which_armor(worm,4), poVar5 == (obj *)0x0 ||
              (poVar5 = which_armor(worm,4), poVar5->otyp != 0x4f)))) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0029646f;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0029646a;
            }
            else {
LAB_0029646a:
              if (ublindf != (obj *)0x0) {
LAB_0029646f:
                if (ublindf->oartifact == '\x1d') goto LAB_002964fd;
              }
              if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                   (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                   youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) {
                return worm;
              }
            }
LAB_002964fd:
            if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
               (iVar3 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar3 < 0x41)) {
              return worm;
            }
          }
          if (u.uprops[0x42].intrinsic != 0) {
            return worm;
          }
          if (u.uprops[0x42].extrinsic != 0) {
            return worm;
          }
          bVar2 = match_warn_of_mon(worm);
          if (bVar2 != '\0') {
            return worm;
          }
          range = iVar14;
          if (iVar11 != 4) {
            map_invisible(bhitpos.x,bhitpos.y);
            return worm;
          }
        }
      }
      poVar5 = obj;
      y = bhitpos.y;
      x = bhitpos.x;
      if (local_38 == (_func_int_obj_ptr_obj_ptr *)0x0) {
        if (iVar11 == 2) {
          if ((obj->oclass != '\f') || (level->objects[bhitpos.x][bhitpos.y] == (obj *)0x0)) {
            bVar2 = costly_spot(bhitpos.x,bhitpos.y);
            bVar2 = ship_object(poVar5,x,y,bVar2);
            if (bVar2 == '\0') goto LAB_00295deb;
          }
          worm = (monst *)0x0;
LAB_00296631:
          tmp_at(-6,0);
          return worm;
        }
      }
      else {
        iVar11 = bhitpile(obj,local_38,(int)bhitpos.x,(int)bhitpos.y);
        range = range + -1 + (uint)(iVar11 == 0);
      }
LAB_00295deb:
      uVar16 = local_50;
      uVar17 = local_6c;
      bVar13 = local_71;
      if ((bVar18) && ((local_54 == 0x17 || (local_54 == 0xf)))) {
        uVar8 = (ushort)obj->otyp - 0x186;
        if ((((uVar8 < 0x3f) && ((0x4000000000000043U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) ||
            ((ushort)obj->otyp - 0x1cc < 2)) &&
           (bVar2 = doorlock(obj,(int)bhitpos.x,(int)bhitpos.y), bVar2 != '\0')) {
          lVar12 = (long)bhitpos.y;
          lVar15 = (long)bhitpos.x;
          iVar11 = (int)obj->otyp;
          if (((viz_array[lVar12][lVar15] & 2U) != 0) ||
             (bVar18 = iVar11 == 0x1c4, iVar11 = 0x1c4, bVar18)) {
            discover_object(iVar11,'\x01','\x01');
            lVar15 = (long)bhitpos.x;
            lVar12 = (long)bhitpos.y;
          }
          if (((*(uint *)&level->locations[lVar15][lVar12].field_0x6 & 0x1f0) == 0x10) &&
             (pcVar4 = in_rooms(level,bhitpos.x,bhitpos.y,0x12), *pcVar4 != '\0')) {
            add_damage(bhitpos.x,bhitpos.y,400);
            local_70 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
        }
      }
      if ((bVar13 < 0x11) ||
         (bVar2 = closed_door(level,(int)bhitpos.x,(int)bhitpos.y), bVar2 != '\0')) {
        bhitpos.x = bhitpos.x - (char)local_68;
        goto LAB_002965dc;
      }
      iVar11 = (int)uVar16;
      if (uVar17 == 0) {
LAB_00296019:
        if ((iVar11 == 1) && ((0 < range && (obj->otyp == 0x216)))) {
          poVar5 = sobj_at(0x214,level,local_78,local_7c);
          uVar16 = local_50;
          if (poVar5 != (obj *)0x0) {
            uVar10 = local_70;
            if ((viz_array[local_7c][local_78] & 2U) != 0) {
              pcVar4 = distant_name(obj,xname);
              pcVar4 = The(pcVar4);
              pcVar7 = xname(poVar5);
              pcVar7 = an(pcVar7);
              pline("%s hits %s.",pcVar4,pcVar7);
              uVar10 = local_70;
            }
            goto LAB_002965f1;
          }
          if (obj == uball) {
            bVar2 = test_move(local_78 - (int)local_68,local_7c - (int)local_60,(int)local_68,
                              (int)local_60,0,1);
            if (bVar2 == '\0') {
              uVar10 = local_70;
              if ((viz_array[local_7c][local_78] & 2U) != 0) {
                pcVar4 = distant_name(obj,xname);
                The(pcVar4);
                pline("%s jerks to an abrupt halt.");
                uVar10 = local_70;
              }
              goto LAB_002965f1;
            }
            if (((u.uz.dnum == dungeon_topology.d_sokoban_dnum) &&
                (ptVar6 = t_at(level,local_78,local_7c), ptVar6 != (trap *)0x0)) &&
               (uVar10 = local_70, (byte)((ptVar6->field_0x8 & 0x1f) - 0xb) < 4)) goto LAB_002965f1;
          }
        }
      }
      else {
        if (((level->locations[bhitpos.x][bhitpos.y].field_0x6 & 8) != 0) &&
           ((viz_array[local_7c][local_78] & 2U) != 0)) {
          unmap_object((int)bhitpos.x,(int)bhitpos.y);
          newsym(local_78,local_7c);
        }
        tmp_at((int)bhitpos.x,(int)bhitpos.y);
        (*windowprocs.win_delay)();
        if (iVar11 != 2) {
          if ((iVar11 == 3) || (uVar10 = local_70, bVar13 != 0x1f)) goto LAB_00296019;
          goto LAB_002965ec;
        }
        bVar2 = is_pool(level,(int)bhitpos.x,(int)bhitpos.y);
        uVar10 = local_70;
        if (((bVar2 != '\0') ||
            (bVar2 = is_lava(level,(int)bhitpos.x,(int)bhitpos.y), uVar10 = local_70, bVar2 != '\0')
            ) || (bVar13 == 0x1f)) goto LAB_002965ec;
      }
      bVar18 = true;
      uVar10 = local_70;
      if (range < 1) goto LAB_002965ec;
    }
    uVar17 = 0;
    if (bVar18) {
      uVar17 = mt_random();
      uVar17 = (uint)(uVar17 * -0x33333333 < 0x33333334);
    }
    bVar2 = hits_bars(&obj,iVar3 - (int)local_68,iVar14 - (int)local_60,(int)local_68,(int)local_60,
                      uVar17,1);
    if (bVar2 == '\0') {
      bVar18 = false;
      iVar11 = (int)local_50;
      goto LAB_00295c96;
    }
    if ((obj_destroyed != (boolean *)0x0) && (obj == (obj *)0x0)) {
      *obj_destroyed = '\x01';
    }
    bhitpos.x = bhitpos.x - (char)local_68;
    uVar17 = local_6c;
LAB_002965dc:
    bhitpos.y = bhitpos.y - (char)local_60;
    uVar10 = local_70;
  }
LAB_002965ec:
  cVar9 = (char)uVar10;
  if (uVar17 != 0) {
LAB_002965f1:
    cVar9 = (char)uVar10;
    tmp_at(-6,0);
  }
  if (cVar9 != '\0') {
    pay_for_damage("destroy",'\0');
  }
  return (monst *)0x0;
}

Assistant:

struct monst *beam_hit(int ddx, int ddy, int range,	/* direction and range */
		   int weapon,			/* see values in hack.h */
		   int (*fhitm)(struct monst*, struct obj*),/* fns called when mon/obj hit */
		   int (*fhito)(struct obj*, struct obj*),
		   struct obj *obj,/* object tossed/used */
		   boolean *obj_destroyed)/* has object been deallocated? may be NULL */
{
	struct monst *mtmp;
	uchar typ;
	boolean shopdoor = FALSE, point_blank = TRUE;
	if (obj_destroyed) *obj_destroyed = FALSE;

	if (weapon == KICKED_WEAPON) {
	    /* object starts one square in front of player */
	    bhitpos.x = u.ux + ddx;
	    bhitpos.y = u.uy + ddy;
	    range--;
	} else {
	    bhitpos.x = u.ux;
	    bhitpos.y = u.uy;
	}

	if (weapon == FLASHED_LIGHT) {
	    tmp_at(DISP_BEAM, dbuf_effect(E_MISC, E_flashbeam));
	} else if (weapon != ZAPPED_WAND && weapon != INVIS_BEAM)
	    tmp_at(DISP_OBJECT, dbuf_objid(obj));

	while (range-- > 0) {
	    int x,y;

	    bhitpos.x += ddx;
	    bhitpos.y += ddy;
	    x = bhitpos.x; y = bhitpos.y;

	    if (!isok(x, y)) {
		bhitpos.x -= ddx;
		bhitpos.y -= ddy;
		break;
	    }

	    if (is_pick(obj) && inside_shop(level, x, y) &&
					   (mtmp = shkcatch(obj, x, y))) {
		tmp_at(DISP_END, 0);
		return mtmp;
	    }

	    typ = level->locations[bhitpos.x][bhitpos.y].typ;

	    /* iron bars will block anything big enough */
	    if ((weapon == THROWN_WEAPON || weapon == KICKED_WEAPON) &&
		    typ == IRONBARS &&
		    hits_bars(&obj, x - ddx, y - ddy, ddx, ddy,
			      point_blank ? 0 : !rn2(5), 1)) {
		/* caveat: obj might now be null... */
		if (obj == NULL && obj_destroyed) *obj_destroyed = TRUE;
		bhitpos.x -= ddx;
		bhitpos.y -= ddy;
		break;
	    }

	    if (weapon == ZAPPED_WAND && find_drawbridge(&x,&y)) {
		switch (obj->otyp) {
		    case WAN_OPENING:
		    case SPE_KNOCK:
			if (is_db_wall(bhitpos.x, bhitpos.y)) {
			    if (cansee(x,y) || cansee(bhitpos.x,bhitpos.y))
				makeknown(obj->otyp);
			    open_drawbridge(x,y);
			}
			break;
		    case WAN_LOCKING:
		    case SPE_WIZARD_LOCK:
			if ((cansee(x,y) || cansee(bhitpos.x, bhitpos.y))
			    && level->locations[x][y].typ == DRAWBRIDGE_DOWN)
			    makeknown(obj->otyp);
			if (!close_drawbridge(x, y)) {
			    /* Stop the ray to prevent a door being made
			     * in the drawbridge's doorway.
			     */
			    return NULL;
			}
			break;
		    case WAN_STRIKING:
		    case SPE_FORCE_BOLT:
			/* destroy closed drawbridges, not open ones */
			if (typ == DBWALL) {
			    destroy_drawbridge(x,y);
			    makeknown(obj->otyp);
			}
			break;
		}
	    }

	    if ((mtmp = m_at(level, bhitpos.x, bhitpos.y)) != 0) {
		notonhead = (bhitpos.x != mtmp->mx ||
			     bhitpos.y != mtmp->my);
		if (weapon != FLASHED_LIGHT) {
			if (weapon != ZAPPED_WAND) {
			    if (weapon != INVIS_BEAM) tmp_at(DISP_END, 0);
			    if (cansee(bhitpos.x,bhitpos.y) && !canspotmon(level, mtmp)) {
				if (weapon != INVIS_BEAM) {
				    map_invisible(bhitpos.x, bhitpos.y);
				    return mtmp;
				}
			    } else
				return mtmp;
			}
			if (weapon != INVIS_BEAM) {
			    (*fhitm)(mtmp, obj);
			    range -= 3;
			}
		} else {
		    /* FLASHED_LIGHT hitting invisible monster
		       should pass through instead of stop so
		       we call flash_hits_mon() directly rather
		       than returning mtmp back to caller. That
		       allows the flash to keep on going. Note
		       that we use mtmp->minvis not canspotmon()
		       because it makes no difference whether
		       the hero can see the monster or not.*/
		    if (mtmp->minvis) {
			obj->ox = u.ux,  obj->oy = u.uy;
			flash_hits_mon(mtmp, obj);
		    } else {
			tmp_at(DISP_END, 0);
		    	return mtmp; 	/* caller will call flash_hits_mon */
		    }
		}
	    } else {
		if (weapon == ZAPPED_WAND && obj->otyp == WAN_PROBING &&
		    level->locations[bhitpos.x][bhitpos.y].mem_invis) {
		    unmap_object(bhitpos.x, bhitpos.y);
		    newsym(x, y);
		}
	    }
	    if (fhito) {
		if (bhitpile(obj,fhito,bhitpos.x,bhitpos.y))
		    range--;
	    } else {
		if (weapon == KICKED_WEAPON &&
		      ((obj->oclass == COIN_CLASS &&
			 OBJ_AT(bhitpos.x, bhitpos.y)) ||
			    ship_object(obj, bhitpos.x, bhitpos.y,
					costly_spot(bhitpos.x, bhitpos.y)))) {
			tmp_at(DISP_END, 0);
			return NULL;
		}
	    }
	    if (weapon == ZAPPED_WAND && (IS_DOOR(typ) || typ == SDOOR)) {
		switch (obj->otyp) {
		case WAN_OPENING:
		case WAN_LOCKING:
		case WAN_STRIKING:
		case SPE_KNOCK:
		case SPE_WIZARD_LOCK:
		case SPE_FORCE_BOLT:
		    if (doorlock(obj, bhitpos.x, bhitpos.y)) {
			if (cansee(bhitpos.x, bhitpos.y) ||
			    (obj->otyp == WAN_STRIKING))
			    makeknown(obj->otyp);
			if (level->locations[bhitpos.x][bhitpos.y].doormask == D_BROKEN
			    && *in_rooms(level, bhitpos.x, bhitpos.y, SHOPBASE)) {
			    shopdoor = TRUE;
			    add_damage(bhitpos.x, bhitpos.y, 400L);
			}
		    }
		    break;
		}
	    }
	    if (!ZAP_POS(typ) || closed_door(level, bhitpos.x, bhitpos.y)) {
		bhitpos.x -= ddx;
		bhitpos.y -= ddy;
		break;
	    }
	    if (weapon != ZAPPED_WAND && weapon != INVIS_BEAM) {
		/* 'I' present but no monster: erase */
		/* do this before the tmp_at() */
		if (level->locations[bhitpos.x][bhitpos.y].mem_invis
			&& cansee(x, y)) {
		    unmap_object(bhitpos.x, bhitpos.y);
		    newsym(x, y);
		}
		tmp_at(bhitpos.x, bhitpos.y);
		win_delay_output();
		/* kicked objects fall in pools */
		if ((weapon == KICKED_WEAPON) &&
		   (is_pool(level, bhitpos.x, bhitpos.y) ||
		   is_lava(level, bhitpos.x, bhitpos.y)))
		    break;
		if (IS_SINK(typ) && weapon != FLASHED_LIGHT)
		    break;	/* physical objects fall onto sink */
	    }
	    /* limit range of ball so hero won't make an invalid move */
	    if (weapon == THROWN_WEAPON && range > 0 &&
		obj->otyp == HEAVY_IRON_BALL) {
		struct obj *bobj;
		struct trap *t;
		if ((bobj = sobj_at(BOULDER, level, x, y)) != 0) {
		    if (cansee(x,y))
			pline("%s hits %s.",
			      The(distant_name(obj, xname)), an(xname(bobj)));
		    range = 0;
		} else if (obj == uball) {
		    if (!test_move(x - ddx, y - ddy, ddx, ddy, 0, TEST_MOVE)) {
			/* nb: it didn't hit anything directly */
			if (cansee(x,y))
			    pline("%s jerks to an abrupt halt.",
				  The(distant_name(obj, xname))); /* lame */
			range = 0;
		    } else if (In_sokoban(&u.uz) && (t = t_at(level, x, y)) != 0 &&
			       (t->ttyp == PIT || t->ttyp == SPIKED_PIT ||
				t->ttyp == HOLE || t->ttyp == TRAPDOOR)) {
			/* hero falls into the trap, so ball stops */
			range = 0;
		    }
		}
	    }

	    /* thrown/kicked missile has moved away from its starting spot */
	    point_blank = FALSE;	/* affects passing through iron bars */
	}

	if (weapon != ZAPPED_WAND && weapon != INVIS_BEAM) tmp_at(DISP_END, 0);

	if (shopdoor)
	    pay_for_damage("destroy", FALSE);

	return NULL;
}